

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CenterOfMass.cpp
# Opt level: O2

void __thiscall
OpenMD::CenterOfMass::CenterOfMass
          (CenterOfMass *this,SimInfo *info,string *filename,string *sele1,string *sele2)

{
  string local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  SequentialAnalyzer::SequentialAnalyzer(&this->super_SequentialAnalyzer,info,filename,sele1,sele2);
  (this->super_SequentialAnalyzer)._vptr_SequentialAnalyzer =
       (_func_int **)&PTR__CenterOfMass_00221810;
  (this->values_).
  super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->values_).
  super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->values_).
  super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  getPrefix(&local_50,filename);
  std::operator+(&local_30,&local_50,".com");
  std::__cxx11::string::_M_assign((string *)&(this->super_SequentialAnalyzer).outputFilename_);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

CenterOfMass::CenterOfMass(SimInfo* info, const std::string& filename,
                             const std::string& sele1,
                             const std::string& sele2) :
      SequentialAnalyzer(info, filename, sele1, sele2) {
    setOutputName(getPrefix(filename) + ".com");
  }